

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O2

ReconciliationRegisterResult __thiscall
TxReconciliationTracker::Impl::RegisterPeer
          (Impl *this,NodeId peer_id,bool is_peer_inbound,uint32_t peer_recon_version,
          uint64_t remote_salt)

{
  ulong uVar1;
  bool bVar2;
  __node_ptr p_Var3;
  HashWriter *pHVar4;
  char *__c;
  long lVar5;
  ulong __bkt;
  __hash_code __code;
  byte bVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
  *this_00;
  ReconciliationRegisterResult RVar9;
  TxReconciliationState *__storage;
  variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState> *__v;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  bool is_peer_inbound_local;
  NodeId peer_id_local;
  ulong local_e0;
  ulong local_d8;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock13;
  uint256 full_salt;
  HashWriter local_a0;
  long local_38;
  
  bVar6 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __c = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/txreconciliation.cpp"
  ;
  RVar9 = NOT_FOUND;
  is_peer_inbound_local = is_peer_inbound;
  peer_id_local = peer_id;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock13,&this->m_txreconciliation_mutex,"m_txreconciliation_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/txreconciliation.cpp"
             ,100,false);
  this_00 = &this->m_states;
  __bkt = (ulong)peer_id % (this->m_states)._M_h._M_bucket_count;
  p_Var3 = std::
           _Hashtable<long,_std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,__bkt,&peer_id_local,(__hash_code)__c);
  if (p_Var3 != (__node_ptr)0x0) {
    if ((p_Var3->
        super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
        ).
        super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
        ._M_storage._M_storage.__data[0x20] == '\x01') {
      RVar9 = ALREADY_REGISTERED;
    }
    else {
      if (this->m_recon_version < peer_recon_version) {
        peer_recon_version = this->m_recon_version;
      }
      if (peer_recon_version == 0) {
        RVar9 = PROTOCOL_VIOLATION;
      }
      else {
        __v = (variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState> *)
              ((long)&(p_Var3->
                      super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
                      ._M_storage._M_storage + 8);
        uVar1 = *(ulong *)&(__v->
                           super__Variant_base<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                           ).
                           super__Move_assign_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                           .
                           super__Copy_assign_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                           .
                           super__Move_ctor_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                           .
                           super__Copy_ctor_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                           .
                           super__Variant_storage_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                           ._M_u;
        bVar2 = ::LogAcceptCategory((LogFlags)this_00,(Level)__bkt);
        if (bVar2) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/txreconciliation.cpp"
          ;
          source_file._M_len = 0x69;
          logging_function._M_str = "RegisterPeer";
          logging_function._M_len = 0xc;
          LogPrintFormatInternal<long,bool>
                    (logging_function,source_file,0x79,TXRECONCILIATION,Debug,
                     (ConstevalFormatString<2U>)0xcb6a73,&peer_id_local,&is_peer_inbound_local);
        }
        puVar7 = &(anonymous_namespace)::RECON_SALT_HASHER;
        pHVar4 = &local_a0;
        for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(undefined8 *)(pHVar4->ctx).s = *puVar7;
          puVar7 = puVar7 + (ulong)bVar6 * -2 + 1;
          pHVar4 = (HashWriter *)((long)pHVar4 + ((ulong)bVar6 * -4 + 2) * 4);
        }
        puVar8 = &local_d8;
        if (remote_salt < uVar1) {
          puVar8 = &local_e0;
        }
        local_e0 = remote_salt;
        local_d8 = uVar1;
        pHVar4 = HashWriter::operator<<(&local_a0,puVar8);
        puVar8 = &local_d8;
        if (local_d8 < local_e0) {
          puVar8 = &local_e0;
        }
        pHVar4 = HashWriter::operator<<(pHVar4,puVar8);
        HashWriter::GetSHA256(&full_salt,pHVar4);
        bVar6 = is_peer_inbound_local ^ 1;
        if ((p_Var3->
            super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
            ).
            super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
            ._M_storage._M_storage.__data[0x20] == '\x01') {
          std::get<1ul,unsigned_long,(anonymous_namespace)::TxReconciliationState>(__v);
          (p_Var3->
          super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
          ).
          super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
          ._M_storage._M_storage.__data[8] = bVar6;
          *(undefined8 *)
           ((long)&(p_Var3->
                   super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                   ).
                   super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
                   ._M_storage._M_storage + 0x10) =
               full_salt.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((long)&(p_Var3->
                   super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                   ).
                   super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
                   ._M_storage._M_storage + 0x18) =
               full_salt.super_base_blob<256U>.m_data._M_elems._8_8_;
        }
        else {
          (p_Var3->
          super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
          ).
          super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
          ._M_storage._M_storage.__data[8] = bVar6;
          *(undefined8 *)
           ((long)&(p_Var3->
                   super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                   ).
                   super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
                   ._M_storage._M_storage + 0x10) =
               full_salt.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((long)&(p_Var3->
                   super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                   ).
                   super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
                   ._M_storage._M_storage + 0x18) =
               full_salt.super_base_blob<256U>.m_data._M_elems._8_8_;
          (p_Var3->
          super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
          ).
          super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
          ._M_storage._M_storage.__data[0x20] = '\x01';
          std::get<1ul,unsigned_long,(anonymous_namespace)::TxReconciliationState>(__v);
        }
        RVar9 = SUCCESS;
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return RVar9;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);
        auto recon_state = m_states.find(peer_id);

        if (recon_state == m_states.end()) return ReconciliationRegisterResult::NOT_FOUND;

        if (std::holds_alternative<TxReconciliationState>(recon_state->second)) {
            return ReconciliationRegisterResult::ALREADY_REGISTERED;
        }

        uint64_t local_salt = *std::get_if<uint64_t>(&recon_state->second);

        // If the peer supports the version which is lower than ours, we downgrade to the version
        // it supports. For now, this only guarantees that nodes with future reconciliation
        // versions have the choice of reconciling with this current version. However, they also
        // have the choice to refuse supporting reconciliations if the common version is not
        // satisfactory (e.g. too low).
        const uint32_t recon_version{std::min(peer_recon_version, m_recon_version)};
        // v1 is the lowest version, so suggesting something below must be a protocol violation.
        if (recon_version < 1) return ReconciliationRegisterResult::PROTOCOL_VIOLATION;

        LogPrintLevel(BCLog::TXRECONCILIATION, BCLog::Level::Debug, "Register peer=%d (inbound=%i)\n",
                      peer_id, is_peer_inbound);

        const uint256 full_salt{ComputeSalt(local_salt, remote_salt)};
        recon_state->second = TxReconciliationState(!is_peer_inbound, full_salt.GetUint64(0), full_salt.GetUint64(1));
        return ReconciliationRegisterResult::SUCCESS;
    }